

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

size_t __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::GetSize
          (Serializer<(Diligent::SerializerMode)1> *this)

{
  char (*in_RCX) [17];
  string msg;
  string local_30;
  
  if (this->m_Ptr < this->m_Start) {
    FormatString<char[26],char[17]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_Ptr >= m_Start",
               in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x10b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (long)this->m_Ptr - (long)this->m_Start;
}

Assistant:

size_t GetSize() const
    {
        VERIFY_EXPR(m_Ptr >= m_Start);
        return m_Ptr - m_Start;
    }